

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void Initialise(void)

{
  mapped_type *pmVar1;
  allocator<char> local_be1;
  key_type local_be0;
  unsigned_long local_bc0;
  undefined8 local_bb8;
  undefined8 local_bb0;
  undefined2 local_ba8;
  allocator<char> local_b99;
  key_type local_b98;
  uint local_b74;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined2 local_b60;
  allocator<char> local_b51;
  key_type local_b50;
  uint local_b2c;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined2 local_b18;
  allocator<char> local_b09;
  key_type local_b08;
  uint local_ae4;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined2 local_ad0;
  allocator<char> local_ac1;
  key_type local_ac0;
  uint local_a9c;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined2 local_a88;
  allocator<char> local_a79;
  key_type local_a78;
  uint local_a54;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined2 local_a40;
  allocator<char> local_a31;
  key_type local_a30;
  uint local_a0c;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined2 local_9f8;
  allocator<char> local_9e9;
  key_type local_9e8;
  uint local_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined2 local_9b0;
  allocator<char> local_9a1;
  key_type local_9a0;
  uint local_97c;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined2 local_968;
  allocator<char> local_959;
  key_type local_958;
  uint local_934;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined2 local_920;
  allocator<char> local_911;
  key_type local_910;
  unsigned_short local_8ea;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined2 local_8d8;
  allocator<char> local_8c9;
  key_type local_8c8;
  unsigned_short local_8a2;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined2 local_890;
  allocator<char> local_881;
  key_type local_880;
  unsigned_short local_85a;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined2 local_848;
  allocator<char> local_839;
  key_type local_838;
  unsigned_short local_812;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined2 local_800;
  allocator<char> local_7f1;
  key_type local_7f0;
  unsigned_short local_7ca;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined2 local_7b8;
  allocator<char> local_7a9;
  key_type local_7a8;
  unsigned_short local_782;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined2 local_770;
  allocator<char> local_761;
  key_type local_760;
  unsigned_short local_73a;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined2 local_728;
  allocator<char> local_719;
  key_type local_718;
  unsigned_short local_6f2;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined2 local_6e0;
  allocator<char> local_6d1;
  key_type local_6d0;
  unsigned_short local_6aa;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined2 local_698;
  allocator<char> local_689;
  key_type local_688;
  unsigned_short local_662;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined2 local_650;
  allocator<char> local_641;
  key_type local_640;
  unsigned_short local_61a;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined2 local_608;
  allocator<char> local_5f9;
  key_type local_5f8;
  unsigned_short local_5d2;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined2 local_5c0;
  allocator<char> local_5b1;
  key_type local_5b0;
  unsigned_short local_58a;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined2 local_578;
  allocator<char> local_569;
  key_type local_568;
  unsigned_short local_542;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined2 local_530;
  allocator<char> local_521;
  key_type local_520;
  unsigned_short local_4fa;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined2 local_4e8;
  allocator<char> local_4d9;
  key_type local_4d8;
  unsigned_short local_4b2;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined2 local_4a0;
  allocator<char> local_491;
  key_type local_490;
  unsigned_short local_46a;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined2 local_458;
  allocator<char> local_449;
  key_type local_448;
  unsigned_short local_422;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined2 local_410;
  allocator<char> local_401;
  key_type local_400;
  unsigned_short local_3da;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined2 local_3c8;
  allocator<char> local_3b9;
  key_type local_3b8;
  unsigned_short local_392;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined2 local_380;
  allocator<char> local_371;
  key_type local_370;
  unsigned_short local_34a;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined2 local_338;
  allocator<char> local_329;
  key_type local_328;
  unsigned_short local_302;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined2 local_2f0;
  allocator<char> local_2e1;
  key_type local_2e0;
  uchar local_2b9;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined2 local_2a8;
  allocator<char> local_299;
  key_type local_298;
  uchar local_271;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined2 local_260;
  allocator<char> local_251;
  key_type local_250;
  uchar local_229;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined2 local_218;
  allocator<char> local_209;
  key_type local_208;
  uchar local_1e1;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined2 local_1d0;
  allocator<char> local_1c1;
  key_type local_1c0;
  uchar local_199;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined2 local_188;
  allocator<char> local_179;
  key_type local_178;
  uchar local_151;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined2 local_140;
  allocator<char> local_131;
  key_type local_130;
  uchar local_109;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined2 local_f8;
  allocator<char> local_e9;
  key_type local_e8;
  uchar local_c1;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined2 local_b0;
  allocator<char> local_a1;
  key_type local_a0;
  uchar local_79;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined2 local_68;
  allocator<char> local_49;
  key_type local_48;
  uchar local_21;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined2 local_10;
  
  local_21 = '\a';
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_char,void,void,unsigned_char,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_20,&local_21
            );
  local_10 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"crc8-ccitt",&local_49);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_48);
  pmVar1->reflectIn = (bool)(undefined1)local_10;
  pmVar1->reflectOut = (bool)local_10._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_20;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_18;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_79 = '\a';
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_char,void,void,unsigned_char,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_78,&local_79
            );
  local_68 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"crc8-rohc",&local_a1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_a0);
  pmVar1->reflectIn = (bool)(undefined1)local_68;
  pmVar1->reflectOut = (bool)local_68._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_78;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_70;
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_c1 = 0x9b;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_char,void,void,unsigned_char,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_c0,&local_c1
            );
  local_b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"crc8-cdma2000",&local_e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_e8);
  pmVar1->reflectIn = (bool)(undefined1)local_b0;
  pmVar1->reflectOut = (bool)local_b0._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_c0;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_b8;
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  local_109 = 0x9b;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_char,void,void,unsigned_char,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_108,
             &local_109);
  local_f8 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"crc8-wcdma",&local_131);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_130);
  pmVar1->reflectIn = (bool)(undefined1)local_f8;
  pmVar1->reflectOut = (bool)local_f8._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_108;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_100;
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  local_151 = '\x1d';
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_char,void,void,unsigned_char,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_150,
             &local_151);
  local_140 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"crc8-ebu",&local_179);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_178);
  pmVar1->reflectIn = (bool)(undefined1)local_140;
  pmVar1->reflectOut = (bool)local_140._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_150;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_148;
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  local_199 = '\x1d';
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_char,void,void,unsigned_char,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_198,
             &local_199);
  local_188 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"crc8-i-code",&local_1c1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_1c0);
  pmVar1->reflectIn = (bool)(undefined1)local_188;
  pmVar1->reflectOut = (bool)local_188._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_198;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_190;
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  local_1e1 = '9';
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_char,void,void,unsigned_char,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_1e0,
             &local_1e1);
  local_1d0 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"crc8-darc",&local_209);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_208);
  pmVar1->reflectIn = (bool)(undefined1)local_1d0;
  pmVar1->reflectOut = (bool)local_1d0._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_1e0;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_1d8;
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  local_229 = 0xd5;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_char,void,void,unsigned_char,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_228,
             &local_229);
  local_218 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"crc8-dvb-s2",&local_251);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_250);
  pmVar1->reflectIn = (bool)(undefined1)local_218;
  pmVar1->reflectOut = (bool)local_218._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_228;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_220;
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  local_271 = '\a';
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_char,void,void,unsigned_char,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_270,
             &local_271);
  local_260 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"crc8-itu",&local_299);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_298);
  pmVar1->reflectIn = (bool)(undefined1)local_260;
  pmVar1->reflectOut = (bool)local_260._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_270;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_268;
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  local_2b9 = '1';
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_char,void,void,unsigned_char,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_2b8,
             &local_2b9);
  local_2a8 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"crc8-maxim",&local_2e1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_2e0);
  pmVar1->reflectIn = (bool)(undefined1)local_2a8;
  pmVar1->reflectOut = (bool)local_2a8._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_2b8;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_2b0;
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  local_302 = 0x1021;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_300,
             &local_302);
  local_2f0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"crc16-ccitt",&local_329);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_328);
  pmVar1->reflectIn = (bool)(undefined1)local_2f0;
  pmVar1->reflectOut = (bool)local_2f0._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_300;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_2f8;
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  local_34a = 0x1021;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_348,
             &local_34a);
  local_338 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"crc16-aug-ccitt",&local_371);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_370);
  pmVar1->reflectIn = (bool)(undefined1)local_338;
  pmVar1->reflectOut = (bool)local_338._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_348;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_340;
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  local_392 = 0x1021;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_390,
             &local_392);
  local_380 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"crc16-genibus",&local_3b9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_3b8);
  pmVar1->reflectIn = (bool)(undefined1)local_380;
  pmVar1->reflectOut = (bool)local_380._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_390;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_388;
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  local_3da = 0x1021;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_3d8,
             &local_3da);
  local_3c8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"crc16-xmodem",&local_401)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_400);
  pmVar1->reflectIn = (bool)(undefined1)local_3c8;
  pmVar1->reflectOut = (bool)local_3c8._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_3d8;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_3d0;
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  local_422 = 0x1021;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_420,
             &local_422);
  local_410 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"crc16-mcrf4xx",&local_449);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_448);
  pmVar1->reflectIn = (bool)(undefined1)local_410;
  pmVar1->reflectOut = (bool)local_410._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_420;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_418;
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  local_46a = 0x1021;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_468,
             &local_46a);
  local_458 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"crc16-riello",&local_491)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_490);
  pmVar1->reflectIn = (bool)(undefined1)local_458;
  pmVar1->reflectOut = (bool)local_458._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_468;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_460;
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  local_4b2 = 0x1021;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_4b0,
             &local_4b2);
  local_4a0 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"crc16-tms37157",&local_4d9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_4d8);
  pmVar1->reflectIn = (bool)(undefined1)local_4a0;
  pmVar1->reflectOut = (bool)local_4a0._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_4b0;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_4a8;
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  local_4fa = 0x1021;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_4f8,
             &local_4fa);
  local_4e8 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"crc16-a",&local_521);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_520);
  pmVar1->reflectIn = (bool)(undefined1)local_4e8;
  pmVar1->reflectOut = (bool)local_4e8._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_4f8;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_4f0;
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  local_542 = 0x1021;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_540,
             &local_542);
  local_530 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"crc16-kermit",&local_569)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_568);
  pmVar1->reflectIn = (bool)(undefined1)local_530;
  pmVar1->reflectOut = (bool)local_530._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_540;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_538;
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  local_58a = 0x1021;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_588,
             &local_58a);
  local_578 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"crc16-x25",&local_5b1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_5b0);
  pmVar1->reflectIn = (bool)(undefined1)local_578;
  pmVar1->reflectOut = (bool)local_578._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_588;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_580;
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  local_5d2 = 0x8005;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_5d0,
             &local_5d2);
  local_5c0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"crc16-buypass",&local_5f9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_5f8);
  pmVar1->reflectIn = (bool)(undefined1)local_5c0;
  pmVar1->reflectOut = (bool)local_5c0._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_5d0;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_5c8;
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  local_61a = 0x8005;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_618,
             &local_61a);
  local_608 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,"crc16-dds-110",&local_641);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_640);
  pmVar1->reflectIn = (bool)(undefined1)local_608;
  pmVar1->reflectOut = (bool)local_608._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_618;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_610;
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator(&local_641);
  local_662 = 0x8005;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_660,
             &local_662);
  local_650 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"crc16-arc",&local_689);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_688);
  pmVar1->reflectIn = (bool)(undefined1)local_650;
  pmVar1->reflectOut = (bool)local_650._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_660;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_658;
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator(&local_689);
  local_6aa = 0x8005;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_6a8,
             &local_6aa);
  local_698 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"crc16-maxim",&local_6d1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_6d0);
  pmVar1->reflectIn = (bool)(undefined1)local_698;
  pmVar1->reflectOut = (bool)local_698._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_6a8;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_6a0;
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  local_6f2 = 0x8005;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_6f0,
             &local_6f2);
  local_6e0 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"crc16-usb",&local_719);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_718);
  pmVar1->reflectIn = (bool)(undefined1)local_6e0;
  pmVar1->reflectOut = (bool)local_6e0._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_6f0;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_6e8;
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator(&local_719);
  local_73a = 0x8005;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_738,
             &local_73a);
  local_728 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_760,"crc16-modbus",&local_761)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_760);
  pmVar1->reflectIn = (bool)(undefined1)local_728;
  pmVar1->reflectOut = (bool)local_728._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_738;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_730;
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator(&local_761);
  local_782 = 0x589;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_780,
             &local_782);
  local_770 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"crc16-dect-r",&local_7a9)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_7a8);
  pmVar1->reflectIn = (bool)(undefined1)local_770;
  pmVar1->reflectOut = (bool)local_770._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_780;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_778;
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  local_7ca = 0x589;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_7c8,
             &local_7ca);
  local_7b8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"crc16-dect-x",&local_7f1)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_7f0);
  pmVar1->reflectIn = (bool)(undefined1)local_7b8;
  pmVar1->reflectOut = (bool)local_7b8._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_7c8;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_7c0;
  std::__cxx11::string::~string((string *)&local_7f0);
  std::allocator<char>::~allocator(&local_7f1);
  local_812 = 0x3d65;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_810,
             &local_812);
  local_800 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_838,"crc16-en-13757",&local_839);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_838);
  pmVar1->reflectIn = (bool)(undefined1)local_800;
  pmVar1->reflectOut = (bool)local_800._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_810;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_808;
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  local_85a = 0x3d65;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_858,
             &local_85a);
  local_848 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"crc16-dnp",&local_881);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_880);
  pmVar1->reflectIn = (bool)(undefined1)local_848;
  pmVar1->reflectOut = (bool)local_848._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_858;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_850;
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator(&local_881);
  local_8a2 = 0xc867;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_8a0,
             &local_8a2);
  local_890 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"crc16-cdma2000",&local_8c9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_8c8);
  pmVar1->reflectIn = (bool)(undefined1)local_890;
  pmVar1->reflectOut = (bool)local_890._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_8a0;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_898;
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator(&local_8c9);
  local_8ea = 0xa097;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_short,void,void,unsigned_short,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_8e8,
             &local_8ea);
  local_8d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_910,"crc16-teledisk",&local_911);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_910);
  pmVar1->reflectIn = (bool)(undefined1)local_8d8;
  pmVar1->reflectOut = (bool)local_8d8._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_8e8;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_8e0;
  std::__cxx11::string::~string((string *)&local_910);
  std::allocator<char>::~allocator(&local_911);
  local_934 = 0x4c11db7;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_int,void,void,unsigned_int,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_930,
             &local_934);
  local_920 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_958,"crc32-bzip2",&local_959);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_958);
  pmVar1->reflectIn = (bool)(undefined1)local_920;
  pmVar1->reflectOut = (bool)local_920._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_930;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_928;
  std::__cxx11::string::~string((string *)&local_958);
  std::allocator<char>::~allocator(&local_959);
  local_97c = 0x4c11db7;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_int,void,void,unsigned_int,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_978,
             &local_97c);
  local_968 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a0,"crc32-mpeg2",&local_9a1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_9a0);
  pmVar1->reflectIn = (bool)(undefined1)local_968;
  pmVar1->reflectOut = (bool)local_968._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_978;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_970;
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  local_9c4 = 0x4c11db7;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_int,void,void,unsigned_int,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_9c0,
             &local_9c4);
  local_9b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"crc32-posix",&local_9e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_9e8);
  pmVar1->reflectIn = (bool)(undefined1)local_9b0;
  pmVar1->reflectOut = (bool)local_9b0._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_9c0;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_9b8;
  std::__cxx11::string::~string((string *)&local_9e8);
  std::allocator<char>::~allocator(&local_9e9);
  local_a0c = 0x4c11db7;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_int,void,void,unsigned_int,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_a08,
             &local_a0c);
  local_9f8 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a30,"crc32",&local_a31);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_a30);
  pmVar1->reflectIn = (bool)(undefined1)local_9f8;
  pmVar1->reflectOut = (bool)local_9f8._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_a08;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_a00;
  std::__cxx11::string::~string((string *)&local_a30);
  std::allocator<char>::~allocator(&local_a31);
  local_a54 = 0x4c11db7;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_int,void,void,unsigned_int,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_a50,
             &local_a54);
  local_a40 = 0x101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a78,"crc32-jamcrc",&local_a79)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_a78);
  pmVar1->reflectIn = (bool)(undefined1)local_a40;
  pmVar1->reflectOut = (bool)local_a40._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_a50;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_a48;
  std::__cxx11::string::~string((string *)&local_a78);
  std::allocator<char>::~allocator(&local_a79);
  local_a9c = 0x814141ab;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_int,void,void,unsigned_int,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_a98,
             &local_a9c);
  local_a88 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac0,"crc32-q",&local_ac1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_ac0);
  pmVar1->reflectIn = (bool)(undefined1)local_a88;
  pmVar1->reflectOut = (bool)local_a88._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_a98;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_a90;
  std::__cxx11::string::~string((string *)&local_ac0);
  std::allocator<char>::~allocator(&local_ac1);
  local_ae4 = 0xaf;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_int,void,void,unsigned_int,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_ae0,
             &local_ae4);
  local_ad0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b08,"crc32-xfr",&local_b09);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_b08);
  pmVar1->reflectIn = (bool)(undefined1)local_ad0;
  pmVar1->reflectOut = (bool)local_ad0._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_ae0;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_ad8;
  std::__cxx11::string::~string((string *)&local_b08);
  std::allocator<char>::~allocator(&local_b09);
  local_b2c = 0x1edc6f41;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_int,void,void,unsigned_int,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_b28,
             &local_b2c);
  local_b18 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b50,"crc32-c",&local_b51);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_b50);
  pmVar1->reflectIn = (bool)(undefined1)local_b18;
  pmVar1->reflectOut = (bool)local_b18._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_b28;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_b20;
  std::__cxx11::string::~string((string *)&local_b50);
  std::allocator<char>::~allocator(&local_b51);
  local_b74 = 0xa833982b;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_int,void,void,unsigned_int,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_b70,
             &local_b74);
  local_b60 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b98,"crc32-d",&local_b99);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_b98);
  pmVar1->reflectIn = (bool)(undefined1)local_b60;
  pmVar1->reflectOut = (bool)local_b60._1_1_;
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_b70;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = uStack_b68;
  std::__cxx11::string::~string((string *)&local_b98);
  std::allocator<char>::~allocator(&local_b99);
  local_bc0 = 0x42f0e1eba9ea3693;
  std::variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long>::
  variant<unsigned_long,void,void,unsigned_long,void>
            ((variant<unsigned_char,unsigned_short,unsigned_int,unsigned_long> *)&local_bb8,
             &local_bc0);
  local_ba8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_be0,"crc64-ecma",&local_be1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_be0);
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       local_bb8;
  *(undefined8 *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = local_bb0;
  pmVar1->reflectIn = (bool)(undefined1)local_ba8;
  pmVar1->reflectOut = (bool)local_ba8._1_1_;
  std::__cxx11::string::~string((string *)&local_be0);
  std::allocator<char>::~allocator(&local_be1);
  return;
}

Assistant:

void Initialise()
{
  crcTypes["crc8-ccitt"]    = { uint8_t(0x07), false, false };
  crcTypes["crc8-rohc"]     = { uint8_t(0x07), true,  true };
  crcTypes["crc8-cdma2000"] = { uint8_t(0x9B), false, false };
  crcTypes["crc8-wcdma"]    = { uint8_t(0x9B), true,  true };
  crcTypes["crc8-ebu"]      = { uint8_t(0x1D), true,  true };
  crcTypes["crc8-i-code"]   = { uint8_t(0x1D), false, false };
  crcTypes["crc8-darc"]     = { uint8_t(0x39), true,  true };
  crcTypes["crc8-dvb-s2"]   = { uint8_t(0xD5), false, false };
  crcTypes["crc8-itu"]      = { uint8_t(0x07), false, false };
  crcTypes["crc8-maxim"]    = { uint8_t(0x31), true,  true };

  crcTypes["crc16-ccitt"]     = { uint16_t(0x1021), false, false };
  crcTypes["crc16-aug-ccitt"] = { uint16_t(0x1021), false, false };
  crcTypes["crc16-genibus"]   = { uint16_t(0x1021), false, false };
  crcTypes["crc16-xmodem"]    = { uint16_t(0x1021), false, false };
  crcTypes["crc16-mcrf4xx"]   = { uint16_t(0x1021), true,  true };
  crcTypes["crc16-riello"]    = { uint16_t(0x1021), true,  true };
  crcTypes["crc16-tms37157"]  = { uint16_t(0x1021), true,  true };
  crcTypes["crc16-a"]         = { uint16_t(0x1021), true,  true };
  crcTypes["crc16-kermit"]    = { uint16_t(0x1021), true,  true };
  crcTypes["crc16-x25"]       = { uint16_t(0x1021), true,  true };
  crcTypes["crc16-buypass"]   = { uint16_t(0x8005), false, false };
  crcTypes["crc16-dds-110"]   = { uint16_t(0x8005), false, false };
  crcTypes["crc16-arc"]       = { uint16_t(0x8005), true,  true };
  crcTypes["crc16-maxim"]     = { uint16_t(0x8005), true,  true };
  crcTypes["crc16-usb"]       = { uint16_t(0x8005), true,  true };
  crcTypes["crc16-modbus"]    = { uint16_t(0x8005), true,  true };
  crcTypes["crc16-dect-r"]    = { uint16_t(0x0589), false, false };
  crcTypes["crc16-dect-x"]    = { uint16_t(0x0589), false, false };
  crcTypes["crc16-en-13757"]  = { uint16_t(0x3D65), false, false };
  crcTypes["crc16-dnp"]       = { uint16_t(0x3D65), true,  true };
  crcTypes["crc16-cdma2000"]  = { uint16_t(0xC867), false, false };
  crcTypes["crc16-teledisk"]  = { uint16_t(0xA097), false, false };

  crcTypes["crc32-bzip2"]  = { uint32_t(0x04C11DB7), false, false };
  crcTypes["crc32-mpeg2"]  = { uint32_t(0x04C11DB7), false, false };
  crcTypes["crc32-posix"]  = { uint32_t(0x04C11DB7), false, false };
  crcTypes["crc32"]        = { uint32_t(0x04C11DB7), true,  true };
  crcTypes["crc32-jamcrc"] = { uint32_t(0x04C11DB7), true,  true };
  crcTypes["crc32-q"]      = { uint32_t(0x814141AB), false, false };
  crcTypes["crc32-xfr"]    = { uint32_t(0x000000AF), false, false };
  crcTypes["crc32-c"]      = { uint32_t(0x1EDC6F41), false, false };
  crcTypes["crc32-d"]      = { uint32_t(0xA833982B), false, false };

  crcTypes["crc64-ecma"] = { uint64_t(0x42F0E1EBA9EA3693), false, false };
}